

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position_third_step2.cpp
# Opt level: O0

bool __thiscall
ruckig::PositionThirdOrderStep2::time_acc0
          (PositionThirdOrderStep2 *this,Profile *profile,double vMax,double vMin,double aMax,
          double aMin,double jMax)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  bool bVar10;
  reference pvVar11;
  Profile *pPVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double extraout_XMM0_Qa;
  double dVar16;
  double dVar17;
  double dVar18;
  double extraout_XMM0_Qa_00;
  double dVar19;
  double dVar20;
  double h2;
  double h1_2;
  double h0b_1;
  double h0a_1;
  double h1_1;
  double h0;
  double h0b;
  double h0a;
  double h1;
  double jMax_local;
  double aMin_local;
  double aMax_local;
  double vMin_local;
  double vMax_local;
  Profile *profile_local;
  PositionThirdOrderStep2 *this_local;
  
  dVar13 = sqrt((this->ad_ad / (this->jMax_jMax * 2.0) -
                (this->ad * (aMax - this->a0)) / this->jMax_jMax) +
                (aMax * this->tf + -this->vd) / jMax);
  dVar15 = this->a0;
  pvVar11 = std::array<double,_7UL>::operator[](&profile->t,0);
  *pvVar11 = (aMax - dVar15) / jMax;
  dVar15 = this->tf;
  dVar1 = this->ad;
  pvVar11 = std::array<double,_7UL>::operator[](&profile->t,1);
  *pvVar11 = (dVar15 - dVar1 / jMax) - (dVar13 + dVar13);
  pvVar11 = std::array<double,_7UL>::operator[](&profile->t,2);
  *pvVar11 = dVar13;
  pvVar11 = std::array<double,_7UL>::operator[](&profile->t,3);
  *pvVar11 = 0.0;
  dVar15 = this->af;
  pvVar11 = std::array<double,_7UL>::operator[](&profile->t,4);
  *pvVar11 = (dVar15 - aMax) / jMax + dVar13;
  pvVar11 = std::array<double,_7UL>::operator[](&profile->t,5);
  *pvVar11 = 0.0;
  pvVar11 = std::array<double,_7UL>::operator[](&profile->t,6);
  *pvVar11 = 0.0;
  pPVar12 = profile;
  bVar10 = Profile::
           check_with_timing<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                     (profile,this->tf,jMax,vMax,vMin,aMax,aMin);
  if (bVar10) {
    this_local._7_1_ = true;
  }
  else {
    dVar14 = jMax * 2.0 * (aMax * this->tf + -this->vd) +
             -(this->ad * 2.0) * aMax + -this->a0_a0 + this->af_af;
    dVar15 = this->af * 3.0 *
             (-(jMax * 2.0) * this->vd + aMax * aMax + aMax * 2.0 * jMax * this->tf) +
             -(jMax * 3.0) *
             (jMax * (this->tf * 2.0 * this->v0 + (aMax * this->tf_tf - (this->pd + this->pd))) +
             aMax * (aMax * this->tf + -(this->vd * 2.0))) +
             -(this->a0 * 3.0 * aMax) * (jMax * 2.0 * this->tf + (aMax - (this->af + this->af))) +
             -(this->a0_a0 * 3.0) * (-jMax * this->tf + this->af) +
             -(this->af_af * 6.0) * aMax + this->af_p3 + this->af_p3 + this->a0_p3;
    std::abs((int)pPVar12);
    dVar16 = sqrt(dVar15 * 4.0 * dVar15 + -(dVar14 * 18.0 * dVar14 * dVar14));
    dVar14 = jMax * 3.0 * dVar14;
    dVar15 = this->a0;
    pvVar11 = std::array<double,_7UL>::operator[](&profile->t,0);
    *pvVar11 = (-dVar15 + aMax) / jMax;
    dVar15 = this->a0_p3;
    dVar1 = this->af_p3;
    dVar13 = this->af_af;
    dVar17 = this->tf;
    dVar19 = this->a0_a0;
    dVar18 = this->af;
    dVar2 = this->tf;
    dVar3 = this->af;
    dVar4 = this->vd;
    dVar5 = this->a0;
    dVar6 = this->af_af;
    dVar20 = aMax * aMax + jMax * this->vd;
    dVar7 = this->tf;
    dVar8 = this->vd;
    dVar9 = this->g2;
    pvVar11 = std::array<double,_7UL>::operator[](&profile->t,1);
    *pvVar11 = (-(jMax * 6.0) * (aMax * (aMax * dVar7 + -(dVar8 * 2.0)) + jMax * dVar9) +
               dVar5 * 3.0 * (dVar6 - (dVar20 + dVar20)) +
               dVar3 * 6.0 * (aMax * aMax + -(jMax * dVar4)) +
               dVar19 * (jMax * 3.0 * dVar2 + dVar18 * -3.0 + aMax * 6.0) +
               dVar13 * (aMax * -6.0 + jMax * 3.0 * dVar17) + -dVar15 + dVar1) / dVar14;
    dVar15 = this->ad;
    dVar1 = this->tf;
    pvVar11 = std::array<double,_7UL>::operator[](&profile->t,1);
    dVar13 = *pvVar11;
    pvVar11 = std::array<double,_7UL>::operator[](&profile->t,2);
    *pvVar11 = (-(dVar15 + (extraout_XMM0_Qa * dVar16) / dVar14) / (jMax * 2.0) + dVar1 / 2.0) -
               dVar13 / 2.0;
    pvVar11 = std::array<double,_7UL>::operator[](&profile->t,3);
    *pvVar11 = (extraout_XMM0_Qa * dVar16) / (jMax * dVar14);
    pvVar11 = std::array<double,_7UL>::operator[](&profile->t,4);
    *pvVar11 = 0.0;
    pvVar11 = std::array<double,_7UL>::operator[](&profile->t,5);
    *pvVar11 = 0.0;
    dVar15 = this->tf;
    pvVar11 = std::array<double,_7UL>::operator[](&profile->t,0);
    dVar1 = *pvVar11;
    pvVar11 = std::array<double,_7UL>::operator[](&profile->t,1);
    dVar13 = *pvVar11;
    pvVar11 = std::array<double,_7UL>::operator[](&profile->t,2);
    dVar17 = *pvVar11;
    pvVar11 = std::array<double,_7UL>::operator[](&profile->t,3);
    dVar19 = *pvVar11;
    pvVar11 = std::array<double,_7UL>::operator[](&profile->t,6);
    *pvVar11 = dVar15 - (dVar1 + dVar13 + dVar17 + dVar19);
    pPVar12 = profile;
    bVar10 = Profile::
             check_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                       (profile,this->tf,jMax,vMax,vMin,aMax,aMin);
    if (bVar10) {
      this_local._7_1_ = true;
    }
    else {
      dVar17 = -(aMax * 3.0 * this->jMax_jMax) * this->tf_tf +
               (this->af - aMax) * 6.0 * jMax * this->vd +
               -(this->jMax_jMax * 6.0) * this->g1 +
               this->a0_a0 * 3.0 * (jMax * this->tf + (this->af - (aMax + aMax))) +
               this->a0 * 3.0 * aMax * (aMax * 3.0 - (this->af + this->af)) +
               aMax * 9.0 * aMax * (jMax * this->tf + this->af) +
               -((this->a0 + this->af) * 6.0 * aMax * jMax) * this->tf +
               -((aMax * aMax + this->af_af) * 6.0) * aMax + this->af_p3 + this->af_p3 + this->a0_p3
      ;
      dVar15 = jMax * (-aMax * this->tf + this->vd) + aMax * aMax + -((this->a0 + this->af) * aMax);
      dVar18 = dVar15 + dVar15 + this->a0_a0 + this->af_af;
      std::abs((int)pPVar12);
      dVar19 = sqrt(dVar17 * 4.0 * dVar17 + -(dVar18 * 18.0 * dVar18 * dVar18));
      dVar19 = (extraout_XMM0_Qa_00 / jMax) * dVar19;
      dVar18 = jMax * 6.0 * dVar18;
      dVar15 = this->a0;
      pvVar11 = std::array<double,_7UL>::operator[](&profile->t,0);
      *pvVar11 = (-dVar15 + aMax) / jMax;
      dVar15 = this->ad;
      pvVar11 = std::array<double,_7UL>::operator[](&profile->t,0);
      dVar1 = *pvVar11;
      dVar13 = this->tf;
      pvVar11 = std::array<double,_7UL>::operator[](&profile->t,1);
      *pvVar11 = ((dVar15 / jMax - (dVar1 + dVar1)) - (dVar17 + dVar17 + -dVar19) / dVar18) + dVar13
      ;
      pvVar11 = std::array<double,_7UL>::operator[](&profile->t,2);
      *pvVar11 = -(dVar17 + dVar17 + dVar19) / dVar18;
      pvVar11 = std::array<double,_7UL>::operator[](&profile->t,3);
      *pvVar11 = (dVar17 + dVar17 + -dVar19) / dVar18;
      dVar15 = this->tf;
      pvVar11 = std::array<double,_7UL>::operator[](&profile->t,0);
      dVar1 = *pvVar11;
      pvVar11 = std::array<double,_7UL>::operator[](&profile->t,1);
      dVar13 = *pvVar11;
      pvVar11 = std::array<double,_7UL>::operator[](&profile->t,2);
      dVar17 = *pvVar11;
      pvVar11 = std::array<double,_7UL>::operator[](&profile->t,3);
      dVar19 = *pvVar11;
      pvVar11 = std::array<double,_7UL>::operator[](&profile->t,4);
      *pvVar11 = dVar15 - (dVar1 + dVar13 + dVar17 + dVar19);
      pvVar11 = std::array<double,_7UL>::operator[](&profile->t,5);
      *pvVar11 = 0.0;
      pvVar11 = std::array<double,_7UL>::operator[](&profile->t,6);
      *pvVar11 = 0.0;
      bVar10 = Profile::
               check_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)2>
                         (profile,this->tf,jMax,vMax,vMin,aMax,aMin);
      if (bVar10) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool PositionThirdOrderStep2::time_acc0(Profile& profile, double vMax, double vMin, double aMax, double aMin, double jMax) {
    // UDUD
    {
        const double h1 = std::sqrt(ad_ad/(2*jMax_jMax) - ad*(aMax - a0)/(jMax_jMax) + (aMax*tf - vd)/jMax);

        profile.t[0] = (aMax - a0)/jMax;
        profile.t[1] = tf - ad/jMax - 2*h1;
        profile.t[2] = h1;
        profile.t[3] = 0;
        profile.t[4] = (af - aMax)/jMax + h1;
        profile.t[5] = 0;
        profile.t[6] = 0;

        if (profile.check_with_timing<ControlSigns::UDUD, ReachedLimits::NONE>(tf, jMax, vMax, vMin, aMax, aMin)) {
            return true;
        }
    }

    // UDUD
    {
        const double h0a = -a0_a0 + af_af - 2*ad*aMax + 2*jMax*(aMax*tf - vd);
        const double h0b = a0_p3 + 2*af_p3 - 6*af_af*aMax - 3*a0_a0*(af - jMax*tf) - 3*a0*aMax*(aMax - 2*af + 2*jMax*tf) - 3*jMax*(jMax*(-2*pd + aMax*tf_tf + 2*tf*v0) + aMax*(aMax*tf - 2*vd)) + 3*af*(aMax*aMax + 2*aMax*jMax*tf - 2*jMax*vd);
        const double h0 = std::abs(jMax) * std::sqrt(4*h0b*h0b - 18*h0a*h0a*h0a);
        const double h1 = 3*jMax*h0a;

        profile.t[0] = (-a0 + aMax)/jMax;
        profile.t[1] = (-a0_p3 + af_p3 + af_af*(-6*aMax + 3*jMax*tf) + a0_a0*(-3*af + 6*aMax + 3*jMax*tf) + 6*af*(aMax*aMax - jMax*vd) + 3*a0*(af_af - 2*(aMax*aMax + jMax*vd)) - 6*jMax*(aMax*(aMax*tf - 2*vd) + jMax*g2))/h1;
        profile.t[2] = -(ad + h0/h1)/(2*jMax) + tf/2 - profile.t[1]/2;
        profile.t[3] = h0/(jMax*h1);
        profile.t[4] = 0;
        profile.t[5] = 0;
        profile.t[6] = tf - (profile.t[0] + profile.t[1] + profile.t[2] + profile.t[3]);

        if (profile.check_with_timing<ControlSigns::UDDU, ReachedLimits::NONE>(tf, jMax, vMax, vMin, aMax, aMin)) {
            return true;
        }
    }

    // a3 != 0

    // UDDU Solution 1
    {
        const double h0a = a0_p3 + 2*af_p3 - 6*(af_af + aMax*aMax)*aMax - 6*(a0 + af)*aMax*jMax*tf + 9*aMax*aMax*(af + jMax*tf) + 3*a0*aMax*(-2*af + 3*aMax) + 3*a0_a0*(af - 2*aMax + jMax*tf) - 6*jMax_jMax*g1 + 6*(af - aMax)*jMax*vd - 3*aMax*jMax_jMax*tf_tf;
        const double h0b = a0_a0 + af_af + 2*(aMax*aMax - (a0 + af)*aMax + jMax*(vd - aMax*tf));
        const double h1 = std::abs(jMax)/jMax * std::sqrt(4*h0a*h0a - 18*h0b*h0b*h0b);
        const double h2 = 6*jMax*h0b;

        profile.t[0] = (-a0 + aMax)/jMax;
        profile.t[1] = ad/jMax - 2 * profile.t[0] - (2*h0a - h1)/h2 + tf;
        profile.t[2] = -(2*h0a + h1)/h2;
        profile.t[3] = (2*h0a - h1)/h2;
        profile.t[4] = tf - (profile.t[0] + profile.t[1] + profile.t[2] + profile.t[3]);
        profile.t[5] = 0;
        profile.t[6] = 0;

        if (profile.check_with_timing<ControlSigns::UDDU, ReachedLimits::ACC0>(tf, jMax, vMax, vMin, aMax, aMin)) {
            return true;
        }
    }

    return false;
}